

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O3

void __thiscall deqp::sl::ShaderParser::parseValueBlock(ShaderParser *this,ValueBlock *valueBlock)

{
  pointer pVVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  assumeToken(this,TOKEN_VALUES);
  advanceToken(this);
  assumeToken(this,TOKEN_LEFT_BRACE);
  advanceToken(this);
  while (this->m_curToken - TOKEN_UNIFORM < 3) {
    parseValue(this,valueBlock);
  }
  if (this->m_curToken != TOKEN_RIGHT_BRACE) {
    std::operator+(&local_30,"unexpected token when parsing a value block: ",&this->m_curTokenStr);
    parseError(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  assumeToken(this,TOKEN_RIGHT_BRACE);
  advanceToken(this);
  pVVar1 = (valueBlock->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (int)((long)(valueBlock->values).
                      super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3) * 0x38e38e39;
  if ((int)uVar3 < 1) {
    iVar5 = 1;
  }
  else {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    piVar2 = &pVVar1->arrayLength;
    iVar5 = 1;
    do {
      if (1 < *piVar2) {
        iVar5 = *piVar2;
      }
      piVar2 = piVar2 + 0x12;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  valueBlock->arrayLength = iVar5;
  return;
}

Assistant:

void ShaderParser::parseValueBlock(ShaderCase::ValueBlock& valueBlock)
{
	PARSE_DBG(("    parseValueBlock()\n"));
	advanceToken(TOKEN_VALUES);
	advanceToken(TOKEN_LEFT_BRACE);

	for (;;)
	{
		if (m_curToken == TOKEN_UNIFORM || m_curToken == TOKEN_INPUT || m_curToken == TOKEN_OUTPUT)
			parseValue(valueBlock);
		else if (m_curToken == TOKEN_RIGHT_BRACE)
			break;
		else
			parseError(string("unexpected token when parsing a value block: " + m_curTokenStr));
	}

	advanceToken(TOKEN_RIGHT_BRACE);

	// Compute combined array length of value block.
	int arrayLength = 1;
	for (int valueNdx = 0; valueNdx < (int)valueBlock.values.size(); valueNdx++)
	{
		const ShaderCase::Value& val = valueBlock.values[valueNdx];
		if (val.arrayLength > 1)
		{
			DE_ASSERT(arrayLength == 1 || arrayLength == val.arrayLength);
			arrayLength = val.arrayLength;
		}
	}
	valueBlock.arrayLength = arrayLength;
}